

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::UniversalTersePrinter<const_char16_t_*>::Print(char16_t *str,ostream *os)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  long *local_38 [2];
  long local_28 [2];
  
  if (str != (char16_t *)0x0) {
    pcVar2 = str + -1;
    do {
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar1 != L'\0');
    local_38[0] = local_28;
    std::__cxx11::u16string::_M_construct<char16_t_const*>((u16string *)local_38,str);
    testing::internal::PrintU16StringTo((u16string *)local_38,os);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] * 2 + 2);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  return;
}

Assistant:

static void Print(const char16_t* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::u16string(str), os);
    }
  }